

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asm_aux.cpp
# Opt level: O3

void skiwi::allocate_buffer_as_string(asmcode *code)

{
  skiwi *psVar1;
  uint64_t lab;
  uint64_t lab_00;
  string done;
  string fill;
  operand local_80 [4];
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p._0_4_ = 0x4b;
  local_70._M_dataplus._M_p._0_4_ = 0xb;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_50,(operand *)&local_70);
  local_50._M_dataplus._M_p._0_4_ = 0x40;
  local_70._M_dataplus._M_p._0_4_ = 0x14;
  local_80[0] = MEM_R10;
  local_80[1] = 0xc0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_50,(operand *)&local_70,local_80,(int *)(local_80 + 1));
  local_50._M_dataplus._M_p._0_4_ = 0;
  local_70._M_dataplus._M_p._0_4_ = 0x14;
  local_80[0] = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_50,(operand *)&local_70,local_80);
  local_50._M_dataplus._M_p._0_4_ = 0x40;
  local_70._M_dataplus._M_p._0_4_ = 0x24;
  local_80[0] = NUMBER;
  local_80[1] = 0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_50,(operand *)&local_70,local_80,(int *)(local_80 + 1));
  local_50._M_dataplus._M_p._0_4_ = 0x56;
  local_70._M_dataplus._M_p._0_4_ = 9;
  local_80[0] = NUMBER;
  local_80[1] = 3;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_50,(operand *)&local_70,local_80,(int *)(local_80 + 1));
  local_50._M_dataplus._M_p._0_4_ = 0x2b;
  local_70._M_dataplus._M_p._0_4_ = 9;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_50,(operand *)&local_70);
  local_50._M_dataplus._M_p._0_4_ = 0x40;
  local_70._M_dataplus._M_p._0_4_ = 0xb;
  local_80[0] = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_50,(operand *)&local_70,local_80);
  local_70._M_dataplus._M_p._0_4_ = 0x40;
  local_80[0] = R15;
  local_80[1] = 0x39;
  local_50._M_dataplus._M_p = (pointer)0x200000000000000;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,(operation *)&local_70,local_80,local_80 + 1,(unsigned_long *)&local_50);
  local_50._M_dataplus._M_p._0_4_ = 0x49;
  local_70._M_dataplus._M_p._0_4_ = 9;
  local_80[0] = R15;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_50,(operand *)&local_70,local_80);
  local_50._M_dataplus._M_p._0_4_ = 0x40;
  local_70._M_dataplus._M_p._0_4_ = 0x20;
  local_80[0] = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_50,(operand *)&local_70,local_80);
  local_50._M_dataplus._M_p._0_4_ = 0x40;
  local_70._M_dataplus._M_p._0_4_ = 0x18;
  local_80[0] = RBP;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_50,(operand *)&local_70,local_80);
  local_50._M_dataplus._M_p._0_4_ = 0x49;
  local_70._M_dataplus._M_p._0_4_ = 0x18;
  local_80[0] = NUMBER;
  local_80[1] = 5;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_50,(operand *)&local_70,local_80,(int *)(local_80 + 1));
  local_50._M_dataplus._M_p = (pointer)((ulong)local_50._M_dataplus._M_p._4_4_ << 0x20);
  local_70._M_dataplus._M_p._0_4_ = 0x10;
  local_80[0] = NUMBER;
  local_80[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_50,(operand *)&local_70,local_80,(int *)(local_80 + 1));
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&local_50,psVar1,lab);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&local_70,psVar1,lab_00);
  local_80[0] = ST6;
  local_80[1] = 0x14;
  local_80[2] = 0x23;
  local_80[3] = 0xc0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_80,local_80 + 1,local_80 + 2,(int *)(local_80 + 3));
  local_80[0] = ST4;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_80,&local_50);
  local_80[0] = ST6;
  local_80[1] = 9;
  local_80[2] = 0x24;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_80,local_80 + 1,local_80 + 2);
  local_80[0] = ST6;
  local_80[1] = 0x20;
  local_80[2] = 9;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_80,local_80 + 1,local_80 + 2);
  local_80[0] = EMPTY;
  local_80[1] = 0x14;
  local_80[2] = 0x39;
  local_80[3] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_80,local_80 + 1,local_80 + 2,(int *)(local_80 + 3));
  local_80[0] = EMPTY;
  local_80[1] = 0x10;
  local_80[2] = 0x39;
  local_80[3] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_80,local_80 + 1,local_80 + 2,(int *)(local_80 + 3));
  local_80[0] = RSI;
  local_80[1] = 0xb;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_80,local_80 + 1);
  local_80[0] = XMM13|RBX;
  local_80[1] = 0xb;
  local_80[2] = 0xb;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_80,local_80 + 1,local_80 + 2);
  local_80[0] = BYTE_MEM_R15;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_80,&local_70);
  local_80[0] = BYTE_MEM_R12;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_80,&local_50);
  local_80[0] = ST4;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_80,&local_70);
  local_80[0] = XMM7;
  local_80[1] = 0xb;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_80,local_80 + 1);
  local_80[0] = ST6;
  local_80[1] = 9;
  local_80[2] = 0x18;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_80,local_80 + 1,local_80 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_70._M_dataplus._M_p._4_4_,local_70._M_dataplus._M_p._0_4_) !=
      &local_70.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_70._M_dataplus._M_p._4_4_,local_70._M_dataplus._M_p._0_4_),
                    local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void allocate_buffer_as_string(asmcode& code)
  {
  // assumptions:
  // input: buffer is in BUFFER
  //        size of string is in rax
  // output: result is in rax
  // clobbers r11 and r15
  // does not check the heap
  code.add(asmcode::PUSH, asmcode::RCX);
  code.add(asmcode::MOV, asmcode::R11, BUFFER);
  code.add(asmcode::ADD, asmcode::R11, asmcode::RAX);
  code.add(asmcode::MOV, asmcode::MEM_R11, asmcode::NUMBER, 0); // make closing zeros at end of string in buffer
  code.add(asmcode::SHR, asmcode::RAX, asmcode::NUMBER, 3);
  code.add(asmcode::INC, asmcode::RAX);
  code.add(asmcode::MOV, asmcode::RCX, asmcode::RAX);
  code.add(asmcode::MOV, asmcode::R15, asmcode::NUMBER, (uint64_t)string_tag << (uint64_t)block_shift);
  code.add(asmcode::OR, asmcode::RAX, asmcode::R15);
  code.add(asmcode::MOV, MEM_ALLOC, asmcode::RAX);
  code.add(asmcode::MOV, asmcode::R15, ALLOC);
  code.add(asmcode::OR, asmcode::R15, asmcode::NUMBER, block_tag);
  code.add(asmcode::ADD, ALLOC, asmcode::NUMBER, CELLS(1));

  std::string fill = label_to_string(label++);
  std::string done = label_to_string(label++);

  code.add(asmcode::MOV, asmcode::R11, BUFFER);
  

  code.add(asmcode::LABEL, fill);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::MEM_R11);
  code.add(asmcode::MOV, MEM_ALLOC, asmcode::RAX);
  code.add(asmcode::ADD, asmcode::R11, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::ADD, ALLOC, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::DEC, asmcode::RCX);
  code.add(asmcode::TEST, asmcode::RCX, asmcode::RCX);
  code.add(asmcode::JES, done);
  code.add(asmcode::JMPS, fill);
  code.add(asmcode::LABEL, done);

  code.add(asmcode::POP, asmcode::RCX);

  code.add(asmcode::MOV, asmcode::RAX, asmcode::R15);
  }